

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

CURLcode Curl_setup_conn(connectdata *conn,_Bool *protocol_done)

{
  undefined1 *puVar1;
  Curl_easy *data;
  CURLcode CVar2;
  char *pcVar3;
  curltime cVar4;
  
  data = conn->data;
  Curl_pgrsTime(data,TIMER_NAMELOOKUP);
  if ((conn->handler->flags & 0x10) == 0) {
    *protocol_done = false;
    puVar1 = &(conn->bits).field_0x4;
    *puVar1 = *puVar1 & 0xef;
    if ((data->set).str[0x26] != (char *)0x0) {
      (*Curl_cfree)((data->state).aptr.uagent);
      (data->state).aptr.uagent = (char *)0x0;
      pcVar3 = curl_maprintf("User-Agent: %s\r\n",(data->set).str[0x26]);
      (data->state).aptr.uagent = pcVar3;
      if (pcVar3 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
    }
    (data->req).headerbytecount = 0;
    (data->state).crlf_conversions = 0;
    cVar4 = Curl_now();
    (conn->now).tv_sec = cVar4.tv_sec;
    (conn->now).tv_usec = cVar4.tv_usec;
    if (conn->sock[0] == -1) {
      (conn->bits).tcpconnect[0] = false;
      CVar2 = Curl_connecthost(conn,conn->dns_entry);
      if (CVar2 != CURLE_OK) {
        return CVar2;
      }
    }
    else {
      Curl_pgrsTime(data,TIMER_CONNECT);
      if (((conn->ssl[0].field_0x10 & 1) != 0) || ((conn->handler->protocol & 0x30) != 0)) {
        Curl_pgrsTime(data,TIMER_APPCONNECT);
      }
      (conn->bits).tcpconnect[0] = true;
      *protocol_done = true;
      Curl_updateconninfo(conn,conn->sock[0]);
      Curl_verboseconnect(conn);
    }
    cVar4 = Curl_now();
    (conn->now).tv_sec = cVar4.tv_sec;
    (conn->now).tv_usec = cVar4.tv_usec;
  }
  else {
    *protocol_done = true;
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_setup_conn(struct connectdata *conn,
                         bool *protocol_done)
{
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = conn->data;

  Curl_pgrsTime(data, TIMER_NAMELOOKUP);

  if(conn->handler->flags & PROTOPT_NONETWORK) {
    /* nothing to setup when not using a network */
    *protocol_done = TRUE;
    return result;
  }
  *protocol_done = FALSE; /* default to not done */

#ifndef CURL_DISABLE_PROXY
  /* set proxy_connect_closed to false unconditionally already here since it
     is used strictly to provide extra information to a parent function in the
     case of proxy CONNECT failures and we must make sure we don't have it
     lingering set from a previous invoke */
  conn->bits.proxy_connect_closed = FALSE;
#endif
  /*
   * Set user-agent. Used for HTTP, but since we can attempt to tunnel
   * basically anything through a http proxy we can't limit this based on
   * protocol.
   */
  if(data->set.str[STRING_USERAGENT]) {
    Curl_safefree(data->state.aptr.uagent);
    data->state.aptr.uagent =
      aprintf("User-Agent: %s\r\n", data->set.str[STRING_USERAGENT]);
    if(!data->state.aptr.uagent)
      return CURLE_OUT_OF_MEMORY;
  }

  data->req.headerbytecount = 0;

#ifdef CURL_DO_LINEEND_CONV
  data->state.crlf_conversions = 0; /* reset CRLF conversion counter */
#endif /* CURL_DO_LINEEND_CONV */

  /* set start time here for timeout purposes in the connect procedure, it
     is later set again for the progress meter purpose */
  conn->now = Curl_now();

  if(CURL_SOCKET_BAD == conn->sock[FIRSTSOCKET]) {
    conn->bits.tcpconnect[FIRSTSOCKET] = FALSE;
    result = Curl_connecthost(conn, conn->dns_entry);
    if(result)
      return result;
  }
  else {
    Curl_pgrsTime(data, TIMER_CONNECT);    /* we're connected already */
    if(conn->ssl[FIRSTSOCKET].use ||
       (conn->handler->protocol & PROTO_FAMILY_SSH))
      Curl_pgrsTime(data, TIMER_APPCONNECT); /* we're connected already */
    conn->bits.tcpconnect[FIRSTSOCKET] = TRUE;
    *protocol_done = TRUE;
    Curl_updateconninfo(conn, conn->sock[FIRSTSOCKET]);
    Curl_verboseconnect(conn);
  }

  conn->now = Curl_now(); /* time this *after* the connect is done, we set
                             this here perhaps a second time */
  return result;
}